

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O3

void __thiscall
burst::
difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>
::difference_iterator
          (difference_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_std::less<void>_>
           *this,char *minuend_begin,char *minuend_end,char *subtrahend_begin,char *subtrahend_end)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  
  (this->m_minuend_begin)._M_current = minuend_begin;
  (this->m_minuend_end)._M_current = minuend_end;
  (this->m_subtrahend_begin)._M_current = subtrahend_begin;
  (this->m_subtrahend_end)._M_current = subtrahend_end;
  if (minuend_begin != minuend_end) {
    pcVar3 = minuend_begin + 1;
    do {
      minuend_begin = minuend_end;
      if (pcVar3 == minuend_end) break;
      cVar2 = *pcVar3;
      pcVar1 = pcVar3 + -1;
      minuend_begin = pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (*pcVar1 <= cVar2);
  }
  if (minuend_begin != minuend_end) {
    __assert_fail("std::is_sorted(m_minuend_begin, m_minuend_end, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/difference_iterator.hpp"
                  ,0x6b,
                  "burst::difference_iterator<__gnu_cxx::__normal_iterator<const char *, std::vector<char>>, __gnu_cxx::__normal_iterator<const char *, std::vector<char>>>::difference_iterator(minuend_iterator, minuend_iterator, subtrahend_iterator, subtrahend_iterator, Compare) [ForwardIterator1 = __gnu_cxx::__normal_iterator<const char *, std::vector<char>>, ForwardIterator2 = __gnu_cxx::__normal_iterator<const char *, std::vector<char>>, Compare = std::less<void>]"
                 );
  }
  if (subtrahend_begin != subtrahend_end) {
    pcVar3 = subtrahend_begin + 1;
    do {
      subtrahend_begin = subtrahend_end;
      if (pcVar3 == subtrahend_end) break;
      cVar2 = *pcVar3;
      pcVar1 = pcVar3 + -1;
      subtrahend_begin = pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (*pcVar1 <= cVar2);
  }
  if (subtrahend_begin != subtrahend_end) {
    __assert_fail("std::is_sorted(m_subtrahend_begin, m_subtrahend_end, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/difference_iterator.hpp"
                  ,0x6c,
                  "burst::difference_iterator<__gnu_cxx::__normal_iterator<const char *, std::vector<char>>, __gnu_cxx::__normal_iterator<const char *, std::vector<char>>>::difference_iterator(minuend_iterator, minuend_iterator, subtrahend_iterator, subtrahend_iterator, Compare) [ForwardIterator1 = __gnu_cxx::__normal_iterator<const char *, std::vector<char>>, ForwardIterator2 = __gnu_cxx::__normal_iterator<const char *, std::vector<char>>, Compare = std::less<void>]"
                 );
  }
  maintain_invariant(this);
  return;
}

Assistant:

difference_iterator
            (
                minuend_iterator minuend_begin,
                minuend_iterator minuend_end,
                subtrahend_iterator subtrahend_begin,
                subtrahend_iterator subtrahend_end,
                Compare compare = Compare()
            ):
            m_minuend_begin(std::move(minuend_begin)),
            m_minuend_end(std::move(minuend_end)),
            m_subtrahend_begin(std::move(subtrahend_begin)),
            m_subtrahend_end(std::move(subtrahend_end)),
            m_compare(compare)
        {
            BOOST_ASSERT(std::is_sorted(m_minuend_begin, m_minuend_end, compare));
            BOOST_ASSERT(std::is_sorted(m_subtrahend_begin, m_subtrahend_end, compare));

            maintain_invariant();
        }